

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

string * __thiscall Color::colorize(string *__return_storage_ptr__,Color *this,string *input)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  uint uVar5;
  bool local_1b1;
  stringstream local_1b0 [7];
  bool needTerminator;
  stringstream result;
  ostream local_1a0 [380];
  int local_24;
  string *psStack_20;
  int count;
  string *input_local;
  Color *this_local;
  
  psStack_20 = input;
  input_local = (string *)this;
  this_local = (Color *)__return_storage_ptr__;
  bVar1 = nontrivial(this);
  if (bVar1) {
    local_24 = 0;
    std::__cxx11::stringstream::stringstream(local_1b0);
    if ((this->_value & 0x200000) == 0) {
      std::operator<<(local_1a0,"\x1b[");
      if ((this->_value & 0x20000) != 0) {
        iVar4 = local_24 + 1;
        bVar1 = local_24 != 0;
        local_24 = iVar4;
        if (bVar1) {
          std::operator<<(local_1a0,";");
        }
        std::operator<<(local_1a0,"1");
      }
      if ((this->_value & 0x40000) != 0) {
        iVar4 = local_24 + 1;
        bVar1 = local_24 != 0;
        local_24 = iVar4;
        if (bVar1) {
          std::operator<<(local_1a0,";");
        }
        std::operator<<(local_1a0,"4");
      }
      if ((this->_value & 0x400000) != 0) {
        iVar4 = local_24 + 1;
        bVar1 = local_24 != 0;
        local_24 = iVar4;
        if (bVar1) {
          std::operator<<(local_1a0,";");
        }
        std::operator<<(local_1a0,"7");
      }
      if ((this->_value & 0x80000) != 0) {
        iVar4 = local_24 + 1;
        bVar1 = local_24 != 0;
        local_24 = iVar4;
        if (bVar1) {
          std::operator<<(local_1a0,";");
        }
        std::ostream::operator<<(local_1a0,(byte)this->_value + 0x1d);
      }
      if ((this->_value & 0x100000) != 0) {
        iVar4 = local_24 + 1;
        bVar1 = local_24 != 0;
        local_24 = iVar4;
        if (bVar1) {
          std::operator<<(local_1a0,";");
        }
        uVar2 = this->_value >> 8 & 0xff;
        uVar5 = uVar2 + 0x27;
        if ((this->_value & 0x10000) != 0) {
          uVar5 = uVar2 + 99;
        }
        std::ostream::operator<<(local_1a0,uVar5);
      }
      poVar3 = std::operator<<(local_1a0,"m");
      poVar3 = std::operator<<(poVar3,(string *)psStack_20);
      std::operator<<(poVar3,"\x1b[0m");
      std::__cxx11::stringstream::str();
    }
    else {
      bVar1 = (this->_value & 0x40000) != 0;
      if (bVar1) {
        std::operator<<(local_1a0,"\x1b[4m");
      }
      local_1b1 = (this->_value & 0x400000) != 0;
      if (local_1b1) {
        std::operator<<(local_1a0,"\x1b[7m");
      }
      local_1b1 = local_1b1 || bVar1;
      if ((this->_value & 0x80000) != 0) {
        poVar3 = std::operator<<(local_1a0,"\x1b[38;5;");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(byte)this->_value);
        std::operator<<(poVar3,"m");
        local_1b1 = true;
      }
      if ((this->_value & 0x100000) != 0) {
        poVar3 = std::operator<<(local_1a0,"\x1b[48;5;");
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,(uint)*(byte *)((long)&this->_value + 1));
        std::operator<<(poVar3,"m");
        local_1b1 = true;
      }
      std::operator<<(local_1a0,(string *)psStack_20);
      if (local_1b1) {
        std::operator<<(local_1a0,"\x1b[0m");
      }
      std::__cxx11::stringstream::str();
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input)
{
#ifdef FEATURE_COLOR
  if (!nontrivial ())
    return input;

  int count = 0;
  std::stringstream result;

  // 256 color
  if (_value & _COLOR_256)
  {
    bool needTerminator = false;

    if (_value & _COLOR_UNDERLINE)
    {
      result << "\033[4m";
      needTerminator = true;
    }

    if (_value & _COLOR_INVERSE)
    {
      result << "\033[7m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASFG)
    {
      result << "\033[38;5;" << (_value & _COLOR_FG) << "m";
      needTerminator = true;
    }

    if (_value & _COLOR_HASBG)
    {
      result << "\033[48;5;" << ((_value & _COLOR_BG) >> 8) << "m";
      needTerminator = true;
    }

    result << input;
    if (needTerminator)
      result << "\033[0m";

    return result.str ();
  }

  // 16 color
  else
  {
    result << "\033[";

    if (_value & _COLOR_BOLD)
    {
      if (count++) result << ";";
      result << "1";
    }

    if (_value & _COLOR_UNDERLINE)
    {
      if (count++) result << ";";
      result << "4";
    }

    if (_value & _COLOR_INVERSE)
    {
      if (count++) result << ";";
      result << "7";
    }

    if (_value & _COLOR_HASFG)
    {
      if (count++) result << ";";
      result << (29 + (_value & _COLOR_FG));
    }

    if (_value & _COLOR_HASBG)
    {
      if (count++) result << ";";
      result << ((_value & _COLOR_BRIGHT ? 99 : 39) + ((_value & _COLOR_BG) >> 8));
    }

    result << "m" << input << "\033[0m";
    return result.str ();
  }
#endif

  return input;
}